

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_vertex_sequence.h
# Opt level: O2

void __thiscall
agg::vertex_sequence<agg::vertex_dist,_6U>::add
          (vertex_sequence<agg::vertex_dist,_6U> *this,vertex_dist *val)

{
  uint uVar1;
  vertex_dist **ppvVar2;
  bool bVar3;
  
  uVar1 = (this->super_pod_bvector<agg::vertex_dist,_6U>).m_size;
  if (1 < uVar1) {
    ppvVar2 = (this->super_pod_bvector<agg::vertex_dist,_6U>).m_blocks;
    bVar3 = vertex_dist::operator()
                      (ppvVar2[uVar1 - 2 >> 6] + (uVar1 - 2 & 0x3f),
                       ppvVar2[uVar1 - 1 >> 6] + (uVar1 - 1 & 0x3f));
    if ((!bVar3) && (uVar1 = (this->super_pod_bvector<agg::vertex_dist,_6U>).m_size, uVar1 != 0)) {
      (this->super_pod_bvector<agg::vertex_dist,_6U>).m_size = uVar1 - 1;
    }
  }
  pod_bvector<agg::vertex_dist,_6U>::add(&this->super_pod_bvector<agg::vertex_dist,_6U>,val);
  return;
}

Assistant:

void vertex_sequence<T, S>::add(const T& val)
    {
        if(base_type::size() > 1)
        {
            if(!(*this)[base_type::size() - 2]((*this)[base_type::size() - 1])) 
            {
                base_type::remove_last();
            }
        }
        base_type::add(val);
    }